

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<HashWriter,bool,std::allocator<bool>>
               (HashWriter *os,vector<bool,_std::allocator<bool>_> *v)

{
  uint uVar1;
  long lVar2;
  ulong *puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong *puVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<HashWriter>
            (os,(ulong)(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                ((long)(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (long)(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
  puVar7 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p;
  puVar3 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish
          .super__Bit_iterator_base._M_offset;
  uVar6 = 0;
  while ((uVar5 = (uint)uVar6, puVar7 != puVar3 || (uVar5 != uVar1))) {
    Serialize<HashWriter>(os,(*puVar7 >> (uVar6 & 0x3f) & 1) != 0);
    uVar4 = uVar5 + 1;
    puVar7 = puVar7 + (uVar5 == 0x3f);
    if (uVar5 == 0x3f) {
      uVar4 = 0;
    }
    uVar6 = (ulong)uVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else if constexpr (std::is_same_v<T, bool>) {
        // A special case for std::vector<bool>, as dereferencing
        // std::vector<bool>::const_iterator does not result in a const bool&
        // due to std::vector's special casing for bool arguments.
        WriteCompactSize(os, v.size());
        for (bool elem : v) {
            ::Serialize(os, elem);
        }
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}